

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestDependencyCycle::Run(GraphTestDependencyCycle *this)

{
  Test *pTVar1;
  bool bVar2;
  Node *node;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string err;
  GraphTestDependencyCycle *this_local;
  
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 8));
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build out: cat mid\nbuild mid: cat in\nbuild in: cat pre\nbuild pre: cat out\n",
              (ManifestParserOptions)err.field_2._8_8_);
  std::__cxx11::string::string((string *)local_38);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"out",&local_59);
  node = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
  bVar2 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,node,(string *)local_38);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
             ,0x15c,"scan_.RecomputeDirty(GetNode(\"out\"), &err)");
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("dependency cycle: out -> mid -> in -> pre -> out",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x15d,"\"dependency cycle: out -> mid -> in -> pre -> out\" == err");
  if (!bVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST_F(GraphTest, DependencyCycle) {
  AssertParse(&state_,
"build out: cat mid\n"
"build mid: cat in\n"
"build in: cat pre\n"
"build pre: cat out\n");

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("out"), &err));
  ASSERT_EQ("dependency cycle: out -> mid -> in -> pre -> out", err);
}